

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

anon_enum_32 prepareForBitwiseOperation(QBitArray *self,QBitArray *other)

{
  Data *pDVar1;
  Data *pDVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  anon_enum_32 aVar7;
  QByteArrayData *d2;
  QByteArrayData *d1;
  
  pDVar1 = (self->d).d.d;
  bVar4 = true;
  bVar3 = true;
  if (pDVar1 != (Data *)0x0) {
    bVar3 = 1 < (__int_type_conflict)
                (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>;
  }
  pDVar2 = (other->d).d.d;
  if (pDVar2 != (Data *)0x0) {
    bVar4 = 1 < (__int_type_conflict)
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>;
  }
  aVar7 = Endian;
  if (!(bool)(bVar3 & bVar4)) {
    aVar7 = CLD_EXITED;
    if ((bool)(bVar3 | bVar4)) {
      if (bVar4) {
        return CLD_EXITED;
      }
    }
    else {
      if (pDVar1 == (Data *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = (pDVar1->super_QArrayData).alloc;
      }
      if (pDVar2 == (Data *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = (pDVar2->super_QArrayData).alloc;
      }
      if (lVar6 <= lVar5) {
        return CLD_EXITED;
      }
    }
    QArrayDataPointer<char>::swap((QArrayDataPointer<char> *)self,(QArrayDataPointer<char> *)other);
  }
  return aVar7;
}

Assistant:

bool needsDetach() const noexcept { return !d || d->needsDetach(); }